

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O0

int rateallocate(jpc_enc_t *enc,uint numlyrs,uint_fast32_t *cumlens)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  jpc_enc_tile_t *pjVar6;
  jpc_enc_tcmpt_t *pjVar7;
  jpc_enc_rlvl_t *pjVar8;
  jpc_enc_band_t *pjVar9;
  jpc_enc_cblk_t *pjVar10;
  ulong uVar11;
  jpc_enc_pass_t *pjVar12;
  jas_stream_t *pjVar13;
  int iVar14;
  jas_stream_t *stream;
  long lVar15;
  ulong uVar16;
  jas_stream_t *pjVar17;
  bool local_101;
  uint local_fc;
  uint local_f8;
  uint lyrno_1;
  uint lyrno;
  uint prcno;
  jpc_enc_prc_t *prc;
  jpc_enc_tile_t *tile;
  jpc_flt_t mnrdslope;
  jpc_flt_t mxrdslope;
  jpc_enc_pass_t *pass1;
  jpc_enc_pass_t *endpasses;
  jpc_enc_pass_t *pass;
  jpc_enc_cblk_t *endcblks;
  jpc_enc_cblk_t *cblk;
  jpc_enc_band_t *endbands;
  jpc_enc_band_t *band;
  jpc_enc_rlvl_t *endlvls;
  jpc_enc_rlvl_t *lvl;
  jpc_enc_tcmpt_t *endcomps;
  jpc_enc_tcmpt_t *comp;
  int numiters;
  long oldpos;
  long pos;
  jas_stream_t *pjStack_58;
  int success;
  jpc_flt_t goodthresh;
  jpc_flt_t thresh;
  uint_fast32_t cumlen;
  jas_stream_t *out;
  jpc_flt_t hi;
  jpc_flt_t lo;
  uint_fast32_t *cumlens_local;
  uint numlyrs_local;
  jpc_enc_t *enc_local;
  
  iVar14 = jas_getdbglevel();
  if (9 < iVar14) {
    jas_eprintf("starting rate allocation\n");
  }
  pjVar6 = enc->curtile;
  for (local_f8 = 1; local_f8 < numlyrs - 1; local_f8 = local_f8 + 1) {
    if (cumlens[local_f8] < cumlens[local_f8 - 1]) {
      abort();
    }
  }
  stream = jas_stream_memopen((char *)0x0,0);
  if (stream == (jas_stream_t *)0x0) {
    enc_local._4_4_ = -1;
  }
  else {
    tile = (jpc_enc_tile_t *)0x7fefffffffffffff;
    mnrdslope = 0.0;
    pjVar7 = pjVar6->tcmpts;
    uVar1 = pjVar6->numtcmpts;
    for (endcomps = pjVar6->tcmpts; endcomps != pjVar7 + uVar1; endcomps = endcomps + 1) {
      pjVar8 = endcomps->rlvls;
      uVar2 = endcomps->numrlvls;
      for (endlvls = endcomps->rlvls; endlvls != pjVar8 + uVar2; endlvls = endlvls + 1) {
        if (endlvls->bands != (jpc_enc_band_t *)0x0) {
          pjVar9 = endlvls->bands;
          uVar3 = endlvls->numbands;
          for (endbands = endlvls->bands; endbands != pjVar9 + uVar3; endbands = endbands + 1) {
            if (endbands->data != (jas_matrix_t *)0x0) {
              lyrno_1 = 0;
              _lyrno = endbands->prcs;
              for (; lyrno_1 < endlvls->numprcs; lyrno_1 = lyrno_1 + 1) {
                if (_lyrno->cblks != (jpc_enc_cblk_t *)0x0) {
                  pjVar10 = _lyrno->cblks;
                  uVar4 = _lyrno->numcblks;
                  for (endcblks = _lyrno->cblks; endcblks != pjVar10 + uVar4;
                      endcblks = endcblks + 1) {
                    calcrdslopes(endcblks);
                    for (endpasses = endcblks->passes;
                        endpasses != endcblks->passes + endcblks->numpasses;
                        endpasses = endpasses + 1) {
                      if (0.0 < endpasses->rdslope) {
                        if (endpasses->rdslope < (double)tile) {
                          tile = (jpc_enc_tile_t *)endpasses->rdslope;
                        }
                        if (mnrdslope < endpasses->rdslope) {
                          mnrdslope = endpasses->rdslope;
                        }
                      }
                    }
                  }
                }
                _lyrno = _lyrno + 1;
              }
            }
          }
        }
      }
    }
    iVar14 = jas_getdbglevel();
    if (9 < iVar14) {
      jas_eprintf("min rdslope = %f max rdslope = %f\n",tile,mnrdslope);
    }
    jpc_init_t2state(enc,1);
    for (local_fc = 0; local_fc < numlyrs; local_fc = local_fc + 1) {
      hi = (jpc_flt_t)tile;
      out = (jas_stream_t *)mnrdslope;
      pos._4_4_ = 0;
      pjStack_58 = (jas_stream_t *)0x0;
      comp._4_4_ = 0;
      do {
        uVar11 = cumlens[local_fc];
        if (uVar11 == 0xffffffffffffffff) {
          if (local_fc != numlyrs - 1) {
            __assert_fail("lyrno == numlyrs - 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                          ,0x6b0,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
          }
          pjStack_58 = (jas_stream_t *)0xbff0000000000000;
          pos._4_4_ = 1;
          break;
        }
        pjVar17 = (jas_stream_t *)((hi + (double)out) / 2.0);
        jpc_save_t2state(enc);
        lVar15 = jas_stream_tell(stream);
        if (lVar15 < 0) {
          __assert_fail("oldpos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                        ,0x6bb,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
        }
        pjVar7 = pjVar6->tcmpts;
        uVar1 = pjVar6->numtcmpts;
        for (endcomps = pjVar6->tcmpts; endcomps != pjVar7 + uVar1; endcomps = endcomps + 1) {
          pjVar8 = endcomps->rlvls;
          uVar2 = endcomps->numrlvls;
          for (endlvls = endcomps->rlvls; endlvls != pjVar8 + uVar2; endlvls = endlvls + 1) {
            if (endlvls->bands != (jpc_enc_band_t *)0x0) {
              pjVar9 = endlvls->bands;
              uVar3 = endlvls->numbands;
              for (endbands = endlvls->bands; endbands != pjVar9 + uVar3; endbands = endbands + 1) {
                if (endbands->data != (jas_matrix_t *)0x0) {
                  lyrno_1 = 0;
                  _lyrno = endbands->prcs;
                  for (; lyrno_1 < endlvls->numprcs; lyrno_1 = lyrno_1 + 1) {
                    if (_lyrno->cblks != (jpc_enc_cblk_t *)0x0) {
                      pjVar10 = _lyrno->cblks;
                      uVar4 = _lyrno->numcblks;
                      for (endcblks = _lyrno->cblks; endcblks != pjVar10 + uVar4;
                          endcblks = endcblks + 1) {
                        if (endcblks->curpass != (jpc_enc_pass_t *)0x0) {
                          pjVar12 = endcblks->passes;
                          uVar5 = endcblks->numpasses;
                          mxrdslope = (jpc_flt_t)endcblks->curpass;
                          for (endpasses = endcblks->curpass; endpasses != pjVar12 + uVar5;
                              endpasses = endpasses + 1) {
                            if ((double)pjVar17 <= endpasses->rdslope) {
                              mxrdslope = (jpc_flt_t)(endpasses + 1);
                            }
                          }
                          for (endpasses = endcblks->curpass;
                              endpasses != (jpc_enc_pass_t *)mxrdslope; endpasses = endpasses + 1) {
                            endpasses->lyrno = local_fc;
                          }
                          for (; endpasses != pjVar12 + uVar5; endpasses = endpasses + 1) {
                            endpasses->lyrno = 0xffffffff;
                          }
                        }
                      }
                    }
                    _lyrno = _lyrno + 1;
                  }
                }
              }
            }
          }
        }
        pjVar7 = pjVar6->tcmpts;
        uVar1 = pjVar6->numtcmpts;
        for (endcomps = pjVar6->tcmpts; endcomps != pjVar7 + uVar1; endcomps = endcomps + 1) {
          pjVar8 = endcomps->rlvls;
          uVar2 = endcomps->numrlvls;
          for (endlvls = endcomps->rlvls; endlvls != pjVar8 + uVar2; endlvls = endlvls + 1) {
            if (endlvls->bands != (jpc_enc_band_t *)0x0) {
              for (lyrno_1 = 0; lyrno_1 < endlvls->numprcs; lyrno_1 = lyrno_1 + 1) {
                iVar14 = jpc_enc_encpkt(enc,stream,
                                        (int)(((long)endcomps - (long)pjVar6->tcmpts) / 0x478),
                                        (int)(((long)endlvls - (long)endcomps->rlvls) / 0x68),
                                        lyrno_1,local_fc);
                if (iVar14 != 0) {
                  return -1;
                }
              }
            }
          }
        }
        uVar16 = jas_stream_tell(stream);
        if ((long)uVar16 < 0) {
          __assert_fail("pos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                        ,0x6fd,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
        }
        pjVar13 = pjVar17;
        if (((uVar16 <= uVar11) && (pjVar13 = (jas_stream_t *)hi, uVar16 <= uVar11)) &&
           ((out = pjVar17, pos._4_4_ == 0 || ((double)pjVar17 < (double)pjStack_58)))) {
          pos._4_4_ = 1;
          pjStack_58 = pjVar17;
        }
        hi = (jpc_flt_t)pjVar13;
        jpc_restore_t2state(enc);
        lVar15 = jas_stream_seek(stream,lVar15,0);
        if (lVar15 < 0) {
          abort();
        }
        iVar14 = jas_getdbglevel();
        if (9 < iVar14) {
          jas_eprintf("maxlen=%08ld actuallen=%08ld thresh=%f\n",pjVar17,uVar11,uVar16);
        }
        comp._4_4_ = comp._4_4_ + 1;
        local_101 = hi < (double)out - 0.001 && comp._4_4_ < 0x20;
      } while (local_101);
      if (pos._4_4_ == 0) {
        jas_eprintf("warning: empty layer generated\n");
      }
      iVar14 = jas_getdbglevel();
      if (9 < iVar14) {
        jas_eprintf("success %d goodthresh %f\n",pjStack_58,(ulong)pos._4_4_);
      }
      pjVar7 = pjVar6->tcmpts;
      uVar1 = pjVar6->numtcmpts;
      for (endcomps = pjVar6->tcmpts; endcomps != pjVar7 + uVar1; endcomps = endcomps + 1) {
        pjVar8 = endcomps->rlvls;
        uVar2 = endcomps->numrlvls;
        for (endlvls = endcomps->rlvls; endlvls != pjVar8 + uVar2; endlvls = endlvls + 1) {
          if (endlvls->bands != (jpc_enc_band_t *)0x0) {
            pjVar9 = endlvls->bands;
            uVar3 = endlvls->numbands;
            for (endbands = endlvls->bands; endbands != pjVar9 + uVar3; endbands = endbands + 1) {
              if (endbands->data != (jas_matrix_t *)0x0) {
                lyrno_1 = 0;
                _lyrno = endbands->prcs;
                for (; lyrno_1 < endlvls->numprcs; lyrno_1 = lyrno_1 + 1) {
                  if (_lyrno->cblks != (jpc_enc_cblk_t *)0x0) {
                    pjVar10 = _lyrno->cblks;
                    uVar4 = _lyrno->numcblks;
                    for (endcblks = _lyrno->cblks; endcblks != pjVar10 + uVar4;
                        endcblks = endcblks + 1) {
                      if (endcblks->curpass != (jpc_enc_pass_t *)0x0) {
                        pjVar12 = endcblks->passes;
                        uVar5 = endcblks->numpasses;
                        mxrdslope = (jpc_flt_t)endcblks->curpass;
                        if (pos._4_4_ != 0) {
                          for (endpasses = endcblks->curpass; endpasses != pjVar12 + uVar5;
                              endpasses = endpasses + 1) {
                            if ((double)pjStack_58 <= endpasses->rdslope) {
                              mxrdslope = (jpc_flt_t)(endpasses + 1);
                            }
                          }
                        }
                        for (endpasses = endcblks->curpass; endpasses != (jpc_enc_pass_t *)mxrdslope
                            ; endpasses = endpasses + 1) {
                          endpasses->lyrno = local_fc;
                        }
                        for (; endpasses != pjVar12 + uVar5; endpasses = endpasses + 1) {
                          endpasses->lyrno = 0xffffffff;
                        }
                      }
                    }
                  }
                  _lyrno = _lyrno + 1;
                }
              }
            }
          }
        }
      }
      pjVar7 = pjVar6->tcmpts;
      uVar1 = pjVar6->numtcmpts;
      for (endcomps = pjVar6->tcmpts; endcomps != pjVar7 + uVar1; endcomps = endcomps + 1) {
        pjVar8 = endcomps->rlvls;
        uVar2 = endcomps->numrlvls;
        for (endlvls = endcomps->rlvls; endlvls != pjVar8 + uVar2; endlvls = endlvls + 1) {
          if (endlvls->bands != (jpc_enc_band_t *)0x0) {
            for (lyrno_1 = 0; lyrno_1 < endlvls->numprcs; lyrno_1 = lyrno_1 + 1) {
              iVar14 = jpc_enc_encpkt(enc,stream,
                                      (int)(((long)endcomps - (long)pjVar6->tcmpts) / 0x478),
                                      (int)(((long)endlvls - (long)endcomps->rlvls) / 0x68),lyrno_1,
                                      local_fc);
              if (iVar14 != 0) {
                return -1;
              }
            }
          }
        }
      }
    }
    iVar14 = jas_getdbglevel();
    if (4 < iVar14) {
      dump_layeringinfo(enc);
    }
    jas_stream_close(stream);
    iVar14 = jas_getdbglevel();
    if (9 < iVar14) {
      jas_eprintf("finished rate allocation\n");
    }
    enc_local._4_4_ = 0;
  }
  return enc_local._4_4_;
}

Assistant:

int rateallocate(jpc_enc_t *enc, unsigned numlyrs, uint_fast32_t *cumlens)
{
	jpc_flt_t lo;
	jpc_flt_t hi;
	jas_stream_t *out;
	uint_fast32_t cumlen;
	jpc_flt_t thresh;
	jpc_flt_t goodthresh;
	int success;
	long pos;
	long oldpos;
	int numiters;

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	jpc_enc_pass_t *pass1;
	jpc_flt_t mxrdslope;
	jpc_flt_t mnrdslope;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	unsigned prcno;

	JAS_DBGLOG(10, ("starting rate allocation\n"));

	tile = enc->curtile;

	for (unsigned lyrno = 1; lyrno < numlyrs - 1; ++lyrno) {
		if (cumlens[lyrno - 1] > cumlens[lyrno]) {
			abort();
		}
	}

	if (!(out = jas_stream_memopen(0, 0))) {
		return -1;
	}


	/* Find minimum and maximum R-D slope values. */
	mnrdslope = DBL_MAX;
	mxrdslope = 0;
	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
				  ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						calcrdslopes(cblk);
						endpasses = &cblk->passes[cblk->numpasses];
						for (pass = cblk->passes; pass != endpasses; ++pass) {
							if (pass->rdslope > 0) {
								if (pass->rdslope < mnrdslope) {
									mnrdslope = pass->rdslope;
								}
								if (pass->rdslope > mxrdslope) {
									mxrdslope = pass->rdslope;
								}
							}
						}
					}
				}
			}
		}
	}
	JAS_DBGLOG(10, ("min rdslope = %f max rdslope = %f\n", mnrdslope,
	  mxrdslope));

	jpc_init_t2state(enc, 1);

	for (unsigned lyrno = 0; lyrno < numlyrs; ++lyrno) {

		lo = mnrdslope;
		hi = mxrdslope;

		success = 0;
		goodthresh = 0;
		numiters = 0;

		do {

			cumlen = cumlens[lyrno];
			if (cumlen == UINT_FAST32_MAX) {
				/* Only the last layer can be free of a rate
				  constraint (e.g., for lossless coding). */
				assert(lyrno == numlyrs - 1);
				goodthresh = -1;
				success = 1;
				break;
			}

			thresh = (lo + hi) / 2;

			/* Save the tier 2 coding state. */
			jpc_save_t2state(enc);
			oldpos = jas_stream_tell(out);
			assert(oldpos >= 0);

			/* Assign all passes with R-D slopes greater than or
			  equal to the current threshold to this layer. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					endbands = &lvl->bands[lvl->numbands];
					for (band = lvl->bands; band != endbands; ++band) {
						if (!band->data) {
							continue;
						}
						for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
						  ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							endcblks = &prc->cblks[prc->numcblks];
							for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
								if (cblk->curpass) {
									endpasses = &cblk->passes[cblk->numpasses];
									pass1 = cblk->curpass;
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= thresh) {
											pass1 = &pass[1];
										}
									}
									for (pass = cblk->curpass; pass != pass1;
									  ++pass) {
										pass->lyrno = lyrno;
									}
									for (; pass != endpasses; ++pass) {
										pass->lyrno = -1;
									}
								}
							}
						}
					}
				}
			}

			/* Perform tier 2 coding. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
						if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
						  lvl - comp->rlvls, prcno, lyrno)) {
							return -1;
						}
					}
				}
			}

			pos = jas_stream_tell(out);

			/* Check the rate constraint. */
			assert(pos >= 0);
			if ((uint_fast32_t)pos > cumlen) {
				/* The rate is too high. */
				lo = thresh;
			} else if ((uint_fast32_t)pos <= cumlen) {
				/* The rate is low enough, so try higher. */
				hi = thresh;
				if (!success || thresh < goodthresh) {
					goodthresh = thresh;
					success = 1;
				}
			}

			/* Save the tier 2 coding state. */
			jpc_restore_t2state(enc);
			if (jas_stream_seek(out, oldpos, SEEK_SET) < 0) {
				abort();
			}

			JAS_DBGLOG(10, ("maxlen=%08ld actuallen=%08ld thresh=%f\n",
			  cumlen, pos, thresh));

			++numiters;
		} while (lo < hi - 1e-3 && numiters < 32);

		if (!success) {
			jas_eprintf("warning: empty layer generated\n");
		}

		JAS_DBGLOG(10, ("success %d goodthresh %f\n", success, goodthresh));

		/* Assign all passes with R-D slopes greater than or
		  equal to the selected threshold to this layer. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				endbands = &lvl->bands[lvl->numbands];
				for (band = lvl->bands; band != endbands; ++band) {
					if (!band->data) {
						continue;
					}
					for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
					  ++prcno, ++prc) {
						if (!prc->cblks) {
							continue;
						}
						endcblks = &prc->cblks[prc->numcblks];
						for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
							if (cblk->curpass) {
								endpasses = &cblk->passes[cblk->numpasses];
								pass1 = cblk->curpass;
								if (success) {
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= goodthresh) {
											pass1 = &pass[1];
										}
									}
								}
								for (pass = cblk->curpass; pass != pass1;
								  ++pass) {
									pass->lyrno = lyrno;
								}
								for (; pass != endpasses; ++pass) {
									pass->lyrno = -1;
								}
							}
						}
					}
				}
			}
		}

		/* Perform tier 2 coding. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
					if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
					  lvl - comp->rlvls, prcno, lyrno)) {
						return -1;
					}
				}
			}
		}
	}

	if (jas_getdbglevel() >= 5) {
		dump_layeringinfo(enc);
	}

	jas_stream_close(out);

	JAS_DBGLOG(10, ("finished rate allocation\n"));

	return 0;
}